

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

iterator * __thiscall
idx2::Lookup<unsigned_long,idx2::chunk_exp_cache>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::chunk_exp_cache> *Ht,unsigned_long *Key)

{
  bool bVar1;
  ulong uVar2;
  bool Found;
  i64 Start;
  i64 H;
  unsigned_long *Key_local;
  hash_table<unsigned_long,_idx2::chunk_exp_cache> *Ht_local;
  
  uVar2 = (ulong)((long)Ht->Keys * -0x61c8864680b583eb) >>
          (0x40U - (char)*(undefined8 *)(this + 0x20) & 0x3f);
  bVar1 = false;
  Start = uVar2;
  do {
    if (*(char *)(*(long *)(this + 0x10) + Start) == '\0') break;
    if (*(unsigned_long **)(*(long *)this + Start * 8) == Ht->Keys) {
      bVar1 = true;
      break;
    }
    Start = (1L << ((byte)*(undefined8 *)(this + 0x20) & 0x3f)) - 1U & Start + 1U;
  } while (Start != uVar2);
  if (!bVar1) {
    for (; *(char *)(*(long *)(this + 0x10) + Start) == '\x02';
        Start = (1L << ((byte)*(undefined8 *)(this + 0x20) & 0x3f)) - 1U & Start + 1U) {
    }
  }
  __return_storage_ptr__->Key = (unsigned_long *)(*(long *)this + Start * 8);
  __return_storage_ptr__->Val = (chunk_exp_cache *)(*(long *)(this + 8) + Start * 0x40);
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)this;
  __return_storage_ptr__->Idx = Start;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Lookup(const hash_table<k, v>& Ht, const k& Key)
{
  i64 H = Index(Ht, Hash(Key));
  i64 Start = H;
  bool Found = false;
  while (Ht.Stats[H] != hash_table<k, v>::Empty)
  { // either Occupied or Tombstone
    if (Ht.Keys[H] == Key)
    {
      Found = true;
      break;
    }
    ++H;
    if ((H &= Capacity(Ht) - 1) == Start)
      break;
  }
  if (!Found)
  {
    while (Ht.Stats[H] == hash_table<k, v>::Occupied)
    {
      ++H;
      H &= Capacity(Ht) - 1;
    }
  }
  auto Result = IterAt(Ht, H);
  if (Found)
  {
    idx2_Assert(*Result.Key == Key);
  }
  return Result;
}